

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_clcle(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint val;
  uint val_00;
  uintptr_t o_2;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  DisasJumpType DVar3;
  uintptr_t o_1;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i64 local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = get_field1(s,FLD_O_r1,FLD_C_b1);
  DVar3 = DISAS_NORETURN;
  val_00 = get_field1(s,FLD_O_r3,FLD_C_i3);
  if (((val | val_00) & 1) == 0) {
    pTVar1 = tcg_const_i32_s390x(tcg_ctx,val);
    pTVar2 = tcg_const_i32_s390x(tcg_ctx,val_00);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_48 = o->in2 + (long)tcg_ctx;
    local_50 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_clcle,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_58
                       );
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    set_cc_static(s);
    DVar3 = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
  }
  return DVar3;
}

Assistant:

static DisasJumpType op_clcle(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    TCGv_i32 t1, t3;

    /* r1 and r3 must be even.  */
    if (r1 & 1 || r3 & 1) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    t1 = tcg_const_i32(tcg_ctx, r1);
    t3 = tcg_const_i32(tcg_ctx, r3);
    gen_helper_clcle(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, t1, o->in2, t3);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t3);
    set_cc_static(s);
    return DISAS_NEXT;
}